

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttype1.c
# Opt level: O3

FT_Long FT_Get_PS_Font_Value
                  (FT_Face face,PS_Dict_Keys key,FT_UInt idx,void *value,FT_Long value_len)

{
  FT_Module_Requester p_Var1;
  int iVar2;
  FT_Module_Interface pvVar3;
  
  if (face == (FT_Face)0x0) {
    return 0;
  }
  p_Var1 = ((face->driver->root).clazz)->get_interface;
  if (((p_Var1 != (FT_Module_Requester)0x0) &&
      (pvVar3 = (*p_Var1)(&face->driver->root,"postscript-info"), pvVar3 != (FT_Module_Interface)0x0
      )) && (*(code **)((long)pvVar3 + 0x20) != (code *)0x0)) {
    iVar2 = (**(code **)((long)pvVar3 + 0x20))(face,key,idx,value,value_len);
    return (long)iVar2;
  }
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Long )
  FT_Get_PS_Font_Value( FT_Face       face,
                        PS_Dict_Keys  key,
                        FT_UInt       idx,
                        void         *value,
                        FT_Long       value_len )
  {
    FT_Int             result  = 0;
    FT_Service_PsInfo  service = NULL;


    if ( face )
    {
      FT_FACE_FIND_SERVICE( face, service, POSTSCRIPT_INFO );

      if ( service && service->ps_get_font_value )
        result = service->ps_get_font_value( face, key, idx,
                                             value, value_len );
    }

    return result;
  }